

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusWindow(ImGuiWindow *window,ImGuiFocusRequestFlags flags)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  ImGuiID focus_scope_id;
  ImGuiWindow *window_00;
  
  pIVar1 = GImGui;
  if (((flags & 2U) != 0) && (GImGui->NavWindow != window)) {
    pIVar2 = FindBlockingModal(window);
    if (pIVar2 != (ImGuiWindow *)0x0) {
      if ((pIVar1->DebugLogFlags & 2) != 0) {
        if (window == (ImGuiWindow *)0x0) {
          pcVar3 = "<NULL>";
        }
        else {
          pcVar3 = window->Name;
        }
        DebugLog("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n",pcVar3,
                 pIVar2->Name);
      }
      if (((window != (ImGuiWindow *)0x0) && (window->RootWindow == window)) &&
         ((window->Flags & 0x2000) == 0)) {
        BringWindowToDisplayBehind(window,pIVar2);
      }
      pIVar2 = GetTopMostPopupModal();
      ClosePopupsOverWindow(pIVar2,false);
      return;
    }
  }
  if (((window == (ImGuiWindow *)0x0 || (flags & 1U) == 0) ||
      (pIVar2 = window->NavLastChildNavWindow, pIVar2 == (ImGuiWindow *)0x0)) ||
     (pIVar2->WasActive == false)) {
    pIVar2 = window;
  }
  if (pIVar1->NavWindow != pIVar2) {
    SetNavWindow(pIVar2);
    if (pIVar2 == (ImGuiWindow *)0x0) {
      pIVar1->NavId = 0;
      pIVar1->NavLayer = ImGuiNavLayer_Main;
      focus_scope_id = 0;
    }
    else {
      if (pIVar1->NavDisableMouseHover == true) {
        pIVar1->NavMousePosDirty = true;
      }
      pIVar1->NavId = pIVar2->NavLastIds[0];
      pIVar1->NavLayer = ImGuiNavLayer_Main;
      focus_scope_id = pIVar2->NavRootFocusScopeId;
    }
    SetNavFocusScope(focus_scope_id);
    pIVar1->NavIdIsAlive = false;
    pIVar1->NavLastValidSelectionUserData = -1;
    ClosePopupsOverWindow(pIVar2,false);
  }
  if (pIVar2 == (ImGuiWindow *)0x0) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = pIVar2->RootWindow;
  }
  if (((pIVar1->ActiveId != 0) && (pIVar1->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar1->ActiveIdWindow->RootWindow != window_00 &&
      (pIVar1->ActiveIdNoClearOnFocusLoss == false)))) {
    ClearActiveID();
  }
  if (pIVar2 != (ImGuiWindow *)0x0) {
    BringWindowToFocusFront(window_00);
    if (((uint)(window_00->Flags | pIVar2->Flags) >> 0xd & 1) == 0) {
      BringWindowToDisplayFront(window_00);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window, ImGuiFocusRequestFlags flags)
{
    ImGuiContext& g = *GImGui;

    // Modal check?
    if ((flags & ImGuiFocusRequestFlags_UnlessBelowModal) && (g.NavWindow != window)) // Early out in common case.
        if (ImGuiWindow* blocking_modal = FindBlockingModal(window))
        {
            // This block would typically be reached in two situations:
            // - API call to FocusWindow() with a window under a modal and ImGuiFocusRequestFlags_UnlessBelowModal flag.
            // - User clicking on void or anything behind a modal while a modal is open (window == NULL)
            IMGUI_DEBUG_LOG_FOCUS("[focus] FocusWindow(\"%s\", UnlessBelowModal): prevented by \"%s\".\n", window ? window->Name : "<NULL>", blocking_modal->Name);
            if (window && window == window->RootWindow && (window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
                BringWindowToDisplayBehind(window, blocking_modal); // Still bring right under modal. (FIXME: Could move in focus list too?)
            ClosePopupsOverWindow(GetTopMostPopupModal(), false); // Note how we need to use GetTopMostPopupModal() aad NOT blocking_modal, to handle nested modals
            return;
        }

    // Find last focused child (if any) and focus it instead.
    if ((flags & ImGuiFocusRequestFlags_RestoreFocusedChild) && window != NULL)
        window = NavRestoreLastChildNavWindow(window);

    // Apply focus
    if (g.NavWindow != window)
    {
        SetNavWindow(window);
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavLayer = ImGuiNavLayer_Main;
        SetNavFocusScope(window ? window->NavRootFocusScopeId : 0);
        g.NavIdIsAlive = false;
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;

        // Close popups if any
        ClosePopupsOverWindow(window, false);
    }

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}